

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultipoleAtomTypesSectionParser.cpp
# Opt level: O1

void __thiscall
OpenMD::MultipoleAtomTypesSectionParser::MultipoleAtomTypesSectionParser
          (MultipoleAtomTypesSectionParser *this,ForceFieldOptions *param_1)

{
  long *local_40 [2];
  long local_30 [2];
  
  (this->super_SectionParser).sectionName_._M_dataplus._M_p =
       (pointer)&(this->super_SectionParser).sectionName_.field_2;
  (this->super_SectionParser).sectionName_._M_string_length = 0;
  (this->super_SectionParser).sectionName_.field_2._M_local_buf[0] = '\0';
  (this->super_SectionParser)._vptr_SectionParser = (_func_int **)&PTR__SectionParser_002fe3a8;
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"MultipoleAtomTypes","");
  std::__cxx11::string::_M_assign((string *)&(this->super_SectionParser).sectionName_);
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  return;
}

Assistant:

MultipoleAtomTypesSectionParser::MultipoleAtomTypesSectionParser(
      ForceFieldOptions&) {
    setSectionName("MultipoleAtomTypes");
  }